

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csv_error.cpp
# Opt level: O3

CSVError *
duckdb::CSVError::HeaderSniffingError
          (CSVError *__return_storage_ptr__,CSVReaderOptions *options,
          vector<duckdb::HeaderValue,_true> *best_header_row,idx_t column_count,string *delimiter)

{
  CSVError *pCVar1;
  ostream *poVar2;
  const_reference pvVar3;
  ulong uVar4;
  ulong __n;
  ostringstream error;
  char local_1e9;
  CSVReaderOptions *local_1e8;
  CSVError *local_1e0;
  LinesPerBoundary local_1d8;
  string local_1c8;
  ostringstream local_1a8 [112];
  ios_base local_138 [264];
  
  local_1e8 = options;
  local_1e0 = __return_storage_ptr__;
  ::std::__cxx11::ostringstream::ostringstream(local_1a8);
  ::std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a8,"Error when sniffing file \"",0x1a);
  poVar2 = ::std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)local_1a8,(local_1e8->file_path)._M_dataplus._M_p,
                      (local_1e8->file_path)._M_string_length);
  ::std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\".",2);
  local_1e9 = '\n';
  ::std::__ostream_insert<char,std::char_traits<char>>(poVar2,&local_1e9,1);
  ::std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a8,
             "It was not possible to detect the CSV Header, due to the header having less columns than expected"
             ,0x61);
  local_1e9 = '\n';
  ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,&local_1e9,1);
  ::std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a8,"Number of expected columns: ",0x1c);
  poVar2 = ::std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
  ::std::__ostream_insert<char,std::char_traits<char>>(poVar2,". Actual number of columns ",0x1b);
  poVar2 = ::std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
  local_1e9 = '\n';
  ::std::__ostream_insert<char,std::char_traits<char>>(poVar2,&local_1e9,1);
  ::std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a8,"Detected row as Header:",0x17);
  local_1e9 = '\n';
  ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,&local_1e9,1);
  if ((best_header_row->super_vector<duckdb::HeaderValue,_std::allocator<duckdb::HeaderValue>_>).
      super__Vector_base<duckdb::HeaderValue,_std::allocator<duckdb::HeaderValue>_>._M_impl.
      super__Vector_impl_data._M_finish !=
      (best_header_row->super_vector<duckdb::HeaderValue,_std::allocator<duckdb::HeaderValue>_>).
      super__Vector_base<duckdb::HeaderValue,_std::allocator<duckdb::HeaderValue>_>._M_impl.
      super__Vector_impl_data._M_start) {
    __n = 0;
    do {
      pvVar3 = vector<duckdb::HeaderValue,_true>::operator[](best_header_row,__n);
      if (pvVar3->is_null == true) {
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"NULL",4);
      }
      else {
        pvVar3 = vector<duckdb::HeaderValue,_true>::operator[](best_header_row,__n);
        ::std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_1a8,(pvVar3->value)._M_dataplus._M_p,
                   (pvVar3->value)._M_string_length);
      }
      uVar4 = ((long)(best_header_row->
                     super_vector<duckdb::HeaderValue,_std::allocator<duckdb::HeaderValue>_>).
                     super__Vector_base<duckdb::HeaderValue,_std::allocator<duckdb::HeaderValue>_>.
                     _M_impl.super__Vector_impl_data._M_finish -
               (long)(best_header_row->
                     super_vector<duckdb::HeaderValue,_std::allocator<duckdb::HeaderValue>_>).
                     super__Vector_base<duckdb::HeaderValue,_std::allocator<duckdb::HeaderValue>_>.
                     _M_impl.super__Vector_impl_data._M_start >> 3) * -0x3333333333333333;
      if (__n < uVar4 - 1) {
        poVar2 = ::std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)local_1a8,(delimiter->_M_dataplus)._M_p,
                            delimiter->_M_string_length);
        ::std::__ostream_insert<char,std::char_traits<char>>(poVar2," ",1);
        uVar4 = ((long)(best_header_row->
                       super_vector<duckdb::HeaderValue,_std::allocator<duckdb::HeaderValue>_>).
                       super__Vector_base<duckdb::HeaderValue,_std::allocator<duckdb::HeaderValue>_>
                       ._M_impl.super__Vector_impl_data._M_finish -
                 (long)(best_header_row->
                       super_vector<duckdb::HeaderValue,_std::allocator<duckdb::HeaderValue>_>).
                       super__Vector_base<duckdb::HeaderValue,_std::allocator<duckdb::HeaderValue>_>
                       ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x3333333333333333;
      }
      __n = __n + 1;
    } while (__n < uVar4);
  }
  ::std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a8,anon_var_dwarf_63b9037 + 8,1);
  ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"Possible fixes:",0xf);
  local_1e9 = '\n';
  ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,&local_1e9,1);
  if ((local_1e8->dialect_options).state_machine_options.strict_mode.value == true) {
    ::std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,
               "* Disable the parser\'s strict mode (strict_mode=false) to allow reading rows that do not comply with the CSV standard."
               ,0x76);
    local_1e9 = '\n';
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,&local_1e9,1);
  }
  if ((local_1e8->dialect_options).header.set_by_user == false) {
    ::std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,
               "* Set header (header = true) if your CSV has a header, or (header = false) if it doesn\'t"
               ,0x58);
    local_1e9 = '\n';
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,&local_1e9,1);
  }
  else {
    ::std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,"* Header is set to \'",0x14);
    poVar2 = ::std::ostream::_M_insert<bool>(SUB81(local_1a8,0));
    ::std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\'. Consider unsetting it.",0x19);
    local_1e9 = '\n';
    ::std::__ostream_insert<char,std::char_traits<char>>(poVar2,&local_1e9,1);
  }
  if ((local_1e8->dialect_options).skip_rows.set_by_user == false) {
    ::std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,
               "* Set skip (skip=${n}) to skip ${n} lines at the top of the file",0x40);
    local_1e9 = '\n';
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,&local_1e9,1);
  }
  else {
    ::std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,"* Skip is set to \'",0x12);
    poVar2 = ::std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
    ::std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\'. Consider unsetting it.",0x19);
    local_1e9 = '\n';
    ::std::__ostream_insert<char,std::char_traits<char>>(poVar2,&local_1e9,1);
  }
  if ((local_1e8->ignore_errors).value == false) {
    ::std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,
               "* Enable ignore errors (ignore_errors=true) to ignore potential errors",0x46);
    local_1e9 = '\n';
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,&local_1e9,1);
  }
  if (local_1e8->null_padding == false) {
    ::std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,
               "* Enable null padding (null_padding=true) to pad missing columns with NULL values",
               0x51);
    local_1e9 = '\n';
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,&local_1e9,1);
  }
  ::std::__cxx11::stringbuf::str();
  LinesPerBoundary::LinesPerBoundary(&local_1d8);
  pCVar1 = local_1e0;
  CSVError(local_1e0,&local_1c8,SNIFFING,local_1d8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1c8._M_dataplus._M_p != &local_1c8.field_2) {
    operator_delete(local_1c8._M_dataplus._M_p);
  }
  ::std::__cxx11::ostringstream::~ostringstream(local_1a8);
  ::std::ios_base::~ios_base(local_138);
  return pCVar1;
}

Assistant:

CSVError CSVError::HeaderSniffingError(const CSVReaderOptions &options, const vector<HeaderValue> &best_header_row,
                                       const idx_t column_count, const string &delimiter) {
	std::ostringstream error;
	// 1. Which file
	error << "Error when sniffing file \"" << options.file_path << "\"." << '\n';
	// 2. What's the error
	error << "It was not possible to detect the CSV Header, due to the header having less columns than expected"
	      << '\n';
	// 2.1 What's the expected number of columns
	error << "Number of expected columns: " << column_count << ". Actual number of columns " << best_header_row.size()
	      << '\n';
	// 2.2 What was the detected row
	error << "Detected row as Header:" << '\n';
	for (idx_t i = 0; i < best_header_row.size(); i++) {
		if (best_header_row[i].is_null) {
			error << "NULL";
		} else {
			error << best_header_row[i].value;
		}
		if (i < best_header_row.size() - 1) {
			error << delimiter << " ";
		}
	}
	error << "\n";

	// 3. Suggest how to fix it!
	error << "Possible fixes:" << '\n';
	if (options.dialect_options.state_machine_options.strict_mode.GetValue()) {
		error << "* Disable the parser's strict mode (strict_mode=false) to allow reading rows that do not comply with "
		         "the CSV standard."
		      << '\n';
	}
	// header
	if (!options.dialect_options.header.IsSetByUser()) {
		error << "* Set header (header = true) if your CSV has a header, or (header = false) if it doesn't" << '\n';
	} else {
		error << "* Header is set to \'" << options.dialect_options.header.GetValue() << "\'. Consider unsetting it."
		      << '\n';
	}
	// skip_rows
	if (!options.dialect_options.skip_rows.IsSetByUser()) {
		error << "* Set skip (skip=${n}) to skip ${n} lines at the top of the file" << '\n';
	} else {
		error << "* Skip is set to \'" << options.dialect_options.skip_rows.GetValue() << "\'. Consider unsetting it."
		      << '\n';
	}
	// ignore_errors
	if (!options.ignore_errors.GetValue()) {
		error << "* Enable ignore errors (ignore_errors=true) to ignore potential errors" << '\n';
	}
	// null_padding
	if (!options.null_padding) {
		error << "* Enable null padding (null_padding=true) to pad missing columns with NULL values" << '\n';
	}

	return CSVError(error.str(), SNIFFING, {});
}